

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::cpp::Int64ToString
                   (string *__return_storage_ptr__,string *macro_prefix,int64 number)

{
  char *buffer;
  char *pcVar1;
  AlphaNum *in_R9;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  pointer local_50;
  size_type local_48;
  
  local_50 = (macro_prefix->_M_dataplus)._M_p;
  local_48 = macro_prefix->_M_string_length;
  local_80.piece_data_ = "_LONGLONG(";
  local_80.piece_size_ = 10;
  buffer = local_e0.digits;
  local_e0.piece_data_ = buffer;
  pcVar1 = FastInt64ToBufferLeft(number,buffer);
  local_e0.piece_size_ = (long)pcVar1 - (long)buffer;
  local_b0.piece_data_ = ")";
  local_b0.piece_size_ = 1;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_50,&local_80,&local_e0,&local_b0,in_R9
                   );
  return __return_storage_ptr__;
}

Assistant:

std::string Int64ToString(const std::string& macro_prefix, int64 number) {
  if (number == kint64min) {
    // This needs to be special-cased, see explanation here:
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=52661
    return StrCat(macro_prefix, "_LONGLONG(", number + 1, ") - 1");
  }
  return StrCat(macro_prefix, "_LONGLONG(", number, ")");
}